

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O1

QString * __thiscall
DebugDirEntryWrapper::translateType
          (QString *__return_storage_ptr__,DebugDirEntryWrapper *this,int type)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch(type) {
  case 0:
    goto LAB_00132c1e;
  case 1:
    goto LAB_00132bfc;
  case 2:
    psVar1 = (storage_type *)0x15;
    break;
  case 3:
    psVar1 = (storage_type *)0x16;
    break;
  case 4:
    goto LAB_00132b6f;
  case 5:
    psVar1 = (storage_type *)0x18;
    break;
  case 6:
  case 10:
LAB_00132b6f:
    psVar1 = (storage_type *)0x8;
    break;
  case 7:
    goto LAB_00132c2f;
  case 8:
LAB_00132c2f:
    psVar1 = (storage_type *)0x36;
    break;
  case 9:
LAB_00132c1e:
    psVar1 = (storage_type *)0x7;
    break;
  case 0xb:
    goto LAB_00132b5b;
  case 0xc:
    psVar1 = (storage_type *)0xa;
    break;
  case 0xd:
LAB_00132bfc:
    psVar1 = (storage_type *)0x4;
    break;
  case 0xe:
    goto LAB_00132b5b;
  case 0xf:
    psVar1 = (storage_type *)0x3;
    break;
  case 0x10:
LAB_00132b5b:
    psVar1 = (storage_type *)0x5;
    break;
  default:
    psVar1 = (storage_type *)0x9;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirEntryWrapper::translateType(int type)
{
    switch (type) {
        case pe::DT_UNKNOWN : return "unknown";
        case pe::DT_COFF : return "COFF";
        case pe::DT_CODEVIEW : return "Visual C++ (CodeView)";
        case pe::DT_FPO : return "Frame pointer omission";
        case pe::DT_MISC : return "DBG file";
        case pe::DT_EXCEPTION : return "A copy of .pdata section";
        case pe::DT_FIXUP : return "Reserved";
        case pe::DT_OMAP_TO_SRC : return "mapping from an RVA in image to an RVA in source image";
        case pe::DT_OMAP_FROM_SRC : return "mapping from an RVA in source image to an RVA in image";
        case pe::DT_BORLAND : return "Borland";
        case pe::DT_RESERVED10 : return "Reserved";
        case pe::DT_CLSID : return "CLSID";
        case pe::DT_VC_FEATURE : return "VC Feature";
        case pe::DT_POGO : return "POGO";
        case pe::DT_ILTCG : return "ILTCG";
        case pe::DT_MPX : return "MPX";
        case pe::DT_REPRO : return "REPRO";
    }
    return "<Unknown>";
}